

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

connection_context_t * create_connection_context(uv_os_sock_t sock,int is_server_connection)

{
  uv__queue **ppuVar1;
  uv_poll_t *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  connection_context_t *pcVar8;
  ssize_t sVar9;
  connection_context_t *extraout_RAX;
  int *piVar10;
  connection_context_t *extraout_RAX_00;
  connection_context_t *extraout_RAX_01;
  connection_context_t *extraout_RAX_02;
  uint extraout_EDX;
  uv_loop_t *unaff_RBX;
  uint uVar11;
  uv_handle_t *handle;
  connection_context_t **ppcVar12;
  undefined8 *puVar13;
  connection_context_t *pcVar14;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_98 [16];
  connection_context_t *pcStack_88;
  uv_loop_t *puStack_80;
  connection_context_t *pcStack_78;
  connection_context_t *pcStack_68;
  connection_context_t *pcStack_60;
  uv_loop_t *puStack_58;
  undefined8 local_28;
  void *local_20;
  
  iVar4 = (int)&local_28;
  puVar6 = (uv_loop_t *)malloc(0x130);
  if (puVar6 == (uv_loop_t *)0x0) {
    create_connection_context_cold_3();
LAB_001b2972:
    create_connection_context_cold_1();
  }
  else {
    *(uv_os_sock_t *)&(puVar6->wq_async).handle_queue.prev = sock;
    *(int *)&(puVar6->wq_async).async_cb = is_server_connection;
    (puVar6->wq_async).next_closing = (uv_handle_t *)0x0;
    *(undefined8 *)&(puVar6->wq_async).flags = 0;
    *(undefined8 *)((long)&(puVar6->wq_async).async_cb + 4) = 0;
    *(undefined8 *)((long)&(puVar6->wq_async).queue.next + 4) = 0;
    *(undefined8 *)((long)&(puVar6->wq_async).queue.prev + 4) = 0;
    puVar7 = uv_default_loop();
    iVar3 = uv_poll_init(puVar7,(uv_poll_t *)puVar6,sock);
    piVar10 = (int *)((long)&(puVar6->wq_async).async_cb + 4);
    *piVar10 = *piVar10 + 1;
    ((uv_poll_t *)&puVar6->data)->data = puVar6;
    local_20 = (void *)(long)iVar3;
    local_28._0_4_ = 0;
    local_28._4_4_ = 0;
    unaff_RBX = puVar6;
    if (local_20 != (void *)0x0) goto LAB_001b2972;
    puVar7 = uv_default_loop();
    iVar3 = uv_timer_init(puVar7,(uv_timer_t *)&(puVar6->watcher_queue).prev);
    piVar10 = (int *)((long)&(puVar6->wq_async).async_cb + 4);
    *piVar10 = *piVar10 + 1;
    (puVar6->watcher_queue).prev = (uv__queue *)puVar6;
    local_20 = (void *)(long)iVar3;
    local_28._0_4_ = 0;
    local_28._4_4_ = 0;
    if (local_20 == (void *)0x0) {
      return (connection_context_t *)puVar6;
    }
  }
  puVar6 = (uv_loop_t *)&stack0xffffffffffffffe0;
  create_connection_context_cold_2();
  puVar2 = (uv_poll_t *)((uv_poll_t *)&puVar6->data)->data;
  pcStack_60 = (connection_context_t *)(long)iVar4;
  pcStack_68 = (connection_context_t *)0x0;
  puStack_58 = unaff_RBX;
  if (pcStack_60 == (connection_context_t *)0x0) {
    uVar11 = *(uint *)((long)&puVar2[2].handle_queue.next + 4);
    if ((uVar11 & extraout_EDX) == 0) goto LAB_001b3022;
    if ((~uVar11 & extraout_EDX) != 0) goto LAB_001b3027;
    if ((extraout_EDX & 1) == 0) goto switchD_001b2ba0_caseD_4;
    pcStack_78 = (connection_context_t *)0x1b2b64;
    iVar4 = rand();
    switch(iVar4 % 7) {
    case 0:
    case 1:
      do {
        pcStack_78 = (connection_context_t *)0x1b2bbf;
        sVar9 = recv(puVar2[1].io_watcher.fd,connection_poll_cb::buffer,0x4a,0);
        iVar4 = (int)sVar9;
        if (iVar4 != -1) break;
        pcStack_78 = (connection_context_t *)0x1b2bcd;
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      pcStack_60 = (connection_context_t *)(long)iVar4;
      pcStack_68 = (connection_context_t *)0x0;
      if (-1 < (long)pcStack_60) {
        if (iVar4 < 1) goto LAB_001b2d1a;
        puVar2[2].data = (void *)((long)&(pcStack_60->poll_handle).data + (long)puVar2[2].data);
        break;
      }
      goto LAB_001b304f;
    case 2:
    case 3:
      do {
        while( true ) {
          pcStack_78 = (connection_context_t *)0x1b2cd5;
          sVar9 = recv(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_1,0x3a3,0);
          uVar5 = (uint)sVar9;
          if (uVar5 == 0xffffffff) break;
          if ((int)uVar5 < 1) {
            if (uVar5 == 0) goto LAB_001b2d1a;
            pcStack_78 = (connection_context_t *)0x1b2d01;
            piVar10 = __errno_location();
            iVar4 = *piVar10;
            goto LAB_001b2d03;
          }
          puVar2[2].data = (void *)((long)puVar2[2].data + (ulong)(uVar5 & 0x7fffffff));
        }
        pcStack_78 = (connection_context_t *)0x1b2cf1;
        piVar10 = __errno_location();
        iVar4 = *piVar10;
      } while (iVar4 == 4);
LAB_001b2d03:
      if ((iVar4 != 0xb) && (iVar4 != 0x73)) {
        pcStack_78 = (connection_context_t *)0x1b2d1a;
        connection_poll_cb_cold_3();
LAB_001b2d1a:
        *(undefined4 *)&puVar2[2].close_cb = 1;
        uVar11 = uVar11 & 0xfffffffe;
      }
      break;
    case 4:
      break;
    case 5:
      uVar11 = uVar11 & 0xfffffffe;
      pcStack_78 = (connection_context_t *)0x1b2d3f;
      iVar4 = uv_is_active((uv_handle_t *)(puVar2 + 1));
      if (iVar4 == 0) {
        *(undefined4 *)&puVar2[2].handle_queue.prev = 1;
        pcStack_78 = (connection_context_t *)0x1b2e14;
        uv_timer_start((uv_timer_t *)(puVar2 + 1),delay_timer_cb,10,0);
      }
      else {
        ppuVar1 = &puVar2[2].handle_queue.prev;
        *(byte *)ppuVar1 = *(byte *)ppuVar1 | 1;
      }
      break;
    case 6:
      pcStack_78 = (connection_context_t *)0x1b2d6b;
      uv_poll_start(puVar2,2,connection_poll_cb);
      pcStack_78 = (connection_context_t *)0x1b2d7b;
      uv_poll_start(puVar2,1,connection_poll_cb);
      *(undefined4 *)((long)&puVar2[2].handle_queue.next + 4) = 1;
      break;
    default:
      goto switchD_001b2ba0_default;
    }
switchD_001b2ba0_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_001b2c49_caseD_4;
    if ((puVar2[2].loop < (uv_loop_t *)0x10000) &&
       ((test_mode != '\x01' || (puVar2[2].type == UV_UNKNOWN_HANDLE)))) {
      pcStack_78 = (connection_context_t *)0x1b2c0d;
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        pcVar8 = (connection_context_t *)(0x10000 - (long)puVar2[2].loop);
        pcVar14 = (connection_context_t *)0x67;
        if (pcVar8 < (connection_context_t *)0x67) {
          pcVar14 = pcVar8;
        }
        pcStack_68 = (connection_context_t *)0x0;
        pcStack_60 = pcVar14;
        if (0 < (long)pcVar14) {
          do {
            pcStack_78 = (connection_context_t *)0x1b2c9e;
            sVar9 = send(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_2,(size_t)pcVar14,0);
            uVar5 = (uint)sVar9;
            if (uVar5 != 0xffffffff) {
              if (-1 < (int)uVar5) {
                pcStack_60 = (connection_context_t *)(ulong)(uVar5 & 0x7fffffff);
                pcStack_68 = (connection_context_t *)0x0;
                if (pcStack_60 == (connection_context_t *)0x0) goto LAB_001b308b;
                puVar2[2].loop =
                     (uv_loop_t *)
                     ((long)((uv_loop_t *)((puVar2[2].loop)->reserved + -7))->reserved +
                     (long)&pcStack_60[-1].sock);
                valid_writable_wakeups = valid_writable_wakeups + 1;
                goto switchD_001b2c49_caseD_4;
              }
              pcStack_78 = (connection_context_t *)0x1b2f9e;
              piVar10 = __errno_location();
              iVar4 = *piVar10;
              break;
            }
            pcStack_78 = (connection_context_t *)0x1b2cac;
            piVar10 = __errno_location();
            iVar4 = *piVar10;
          } while (iVar4 == 4);
          if ((iVar4 != 0xb) && (iVar4 != 0x73)) {
            pcStack_78 = (connection_context_t *)0x1b2faf;
            connection_poll_cb_cold_15();
LAB_001b2faf:
            pcStack_78 = (connection_context_t *)0x1b2fb4;
            piVar10 = __errno_location();
            iVar4 = *piVar10;
            goto LAB_001b2fb6;
          }
LAB_001b2fc4:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        goto LAB_001b3063;
      case 2:
      case 3:
        pcVar14 = (connection_context_t *)(0x10000 - (long)puVar2[2].loop);
        if ((connection_context_t *)0x4d1 < pcVar14) {
          pcVar14 = (connection_context_t *)0x4d2;
        }
        pcStack_68 = (connection_context_t *)0x0;
        pcStack_60 = pcVar14;
        if ((long)pcVar14 < 1) goto LAB_001b3072;
        do {
          pcStack_78 = (connection_context_t *)0x1b2ddd;
          sVar9 = send(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_3,(size_t)pcVar14,0);
          uVar5 = (uint)sVar9;
          if (uVar5 != 0xffffffff) {
            if ((int)uVar5 < 0) goto LAB_001b2faf;
            pcStack_60 = (connection_context_t *)(ulong)(uVar5 & 0x7fffffff);
            pcStack_68 = (connection_context_t *)0x0;
            if (pcStack_60 == (connection_context_t *)0x0) goto LAB_001b309a;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            puVar7 = (uv_loop_t *)((long)(puVar2[2].loop)->reserved + (long)&pcStack_60[-1].sock);
            puVar2[2].loop = puVar7;
            goto joined_r0x001b2e9b;
          }
          pcStack_78 = (connection_context_t *)0x1b2de7;
          piVar10 = __errno_location();
          iVar4 = *piVar10;
        } while (iVar4 == 4);
LAB_001b2fb6:
        if ((iVar4 == 0xb) || (iVar4 == 0x73)) goto LAB_001b2fc4;
        goto LAB_001b3086;
      case 4:
        break;
      case 5:
        uVar11 = uVar11 & 0xfffffffd;
        pcStack_78 = (connection_context_t *)0x1b2f51;
        iVar4 = uv_is_active((uv_handle_t *)(puVar2 + 1));
        if (iVar4 == 0) {
          *(undefined4 *)&puVar2[2].handle_queue.prev = 2;
          pcStack_78 = (connection_context_t *)0x1b2ff0;
          uv_timer_start((uv_timer_t *)(puVar2 + 1),delay_timer_cb,100,0);
        }
        else {
          ppuVar1 = &puVar2[2].handle_queue.prev;
          *(byte *)ppuVar1 = *(byte *)ppuVar1 | 2;
        }
        break;
      case 6:
        pcStack_78 = (connection_context_t *)0x1b2f79;
        uv_poll_start(puVar2,1,connection_poll_cb);
        pcStack_78 = (connection_context_t *)0x1b2f89;
        uv_poll_start(puVar2,2,connection_poll_cb);
        *(undefined4 *)((long)&puVar2[2].handle_queue.next + 4) = 2;
        break;
      default:
        goto switchD_001b2c49_default;
      }
switchD_001b2c49_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)&puVar2[2].handle_queue.next = 1;
        disconnects = disconnects + 1;
        uVar11 = uVar11 & 0xfffffffb;
      }
      if (((*(int *)&puVar2[2].close_cb == 0) || (*(int *)((long)&puVar2[2].close_cb + 4) == 0)) ||
         (*(int *)&puVar2[2].handle_queue.next == 0)) {
        if (uVar11 != *(uint *)((long)&puVar2[2].handle_queue.next + 4)) {
          *(uint *)((long)&puVar2[2].handle_queue.next + 4) = uVar11;
          pcStack_78 = (connection_context_t *)0x1b2aea;
          uv_poll_start((uv_poll_t *)puVar6,uVar11,connection_poll_cb);
          uVar11 = *(uint *)((long)&puVar2[2].handle_queue.next + 4);
        }
        if (uVar11 != 0) {
          pcStack_60 = (connection_context_t *)0x1;
          pcStack_78 = (connection_context_t *)0x1b2b06;
          iVar4 = uv_is_active((uv_handle_t *)puVar6);
          pcStack_68 = (connection_context_t *)(long)iVar4;
          if (pcStack_60 == pcStack_68) {
            return pcStack_60;
          }
          pcStack_78 = (connection_context_t *)0x1b2b28;
          connection_poll_cb_cold_17();
        }
      }
      else {
        pcStack_78 = (connection_context_t *)0x1b2a9b;
        close_socket(puVar2[1].io_watcher.fd);
        pcStack_78 = (connection_context_t *)0x1b2aad;
        uv_close((uv_handle_t *)puVar2,connection_close_cb);
        pcStack_78 = (connection_context_t *)0x1b2abc;
        uv_close((uv_handle_t *)(puVar2 + 1),connection_close_cb);
        *(undefined4 *)((long)&puVar2[2].handle_queue.next + 4) = 0;
      }
      pcStack_78 = (connection_context_t *)0x1b2b30;
      iVar4 = uv_is_active((uv_handle_t *)puVar6);
      pcStack_60 = (connection_context_t *)(long)iVar4;
      pcStack_68 = (connection_context_t *)0x0;
      if (pcStack_60 == (connection_context_t *)0x0) {
        return (connection_context_t *)0x0;
      }
      goto LAB_001b302c;
    }
    pcStack_78 = (connection_context_t *)0x1b2a29;
    iVar4 = shutdown(puVar2[1].io_watcher.fd,1);
    pcStack_60 = (connection_context_t *)(long)iVar4;
    pcStack_68 = (connection_context_t *)0x0;
    if (pcStack_60 == (connection_context_t *)0x0) {
      *(undefined4 *)((long)&puVar2[2].close_cb + 4) = 1;
      uVar11 = uVar11 & 0xfffffffd;
      pcStack_60 = (connection_context_t *)0x0;
      goto switchD_001b2c49_caseD_4;
    }
  }
  else {
LAB_001b3013:
    pcStack_78 = (connection_context_t *)0x1b3022;
    connection_poll_cb_cold_1();
LAB_001b3022:
    pcStack_78 = (connection_context_t *)0x1b3027;
    connection_poll_cb_cold_19();
LAB_001b3027:
    puVar6 = unaff_RBX;
    pcStack_78 = (connection_context_t *)0x1b302c;
    connection_poll_cb_cold_2();
LAB_001b302c:
    pcStack_78 = (connection_context_t *)0x1b303b;
    connection_poll_cb_cold_18();
  }
  pcStack_78 = (connection_context_t *)0x1b304a;
  connection_poll_cb_cold_6();
LAB_001b304a:
  pcStack_78 = (connection_context_t *)0x1b304f;
  connection_poll_cb_cold_10();
LAB_001b304f:
  pcStack_78 = (connection_context_t *)0x1b305e;
  connection_poll_cb_cold_4();
switchD_001b2ba0_default:
  pcStack_78 = (connection_context_t *)0x1b3063;
  connection_poll_cb_cold_5();
LAB_001b3063:
  pcStack_78 = (connection_context_t *)0x1b3072;
  connection_poll_cb_cold_13();
LAB_001b3072:
  pcStack_78 = (connection_context_t *)0x1b3081;
  connection_poll_cb_cold_7();
switchD_001b2c49_default:
  pcStack_78 = (connection_context_t *)0x1b3086;
  connection_poll_cb_cold_16();
LAB_001b3086:
  pcStack_78 = (connection_context_t *)0x1b308b;
  connection_poll_cb_cold_12();
LAB_001b308b:
  pcStack_78 = (connection_context_t *)0x1b309a;
  connection_poll_cb_cold_14();
LAB_001b309a:
  pcStack_78 = (connection_context_t *)0x1b30a9;
  connection_poll_cb_cold_8();
LAB_001b30a9:
  handle = (uv_handle_t *)&pcStack_60;
  pcStack_78 = (connection_context_t *)close_socket;
  connection_poll_cb_cold_9();
  puStack_80 = (uv_loop_t *)0x1b30be;
  pcStack_78 = extraout_RAX;
  iVar4 = close((int)handle);
  if (iVar4 == 0) {
    return pcStack_78;
  }
  puStack_80 = (uv_loop_t *)0x1b30c7;
  piVar10 = __errno_location();
  if (*piVar10 == 0x68) {
    return pcStack_78;
  }
  puStack_80 = (uv_loop_t *)delay_timer_cb;
  close_socket_cold_1();
  puVar2 = (uv_poll_t *)handle->data;
  auStack_98._0_8_ = (void *)0x1b30e0;
  puStack_80 = puVar6;
  iVar4 = uv_is_active(handle);
  pcStack_88 = (connection_context_t *)(long)iVar4;
  auStack_98._8_8_ = (uv_loop_t *)0x0;
  if (pcStack_88 == (connection_context_t *)0x0) {
    uVar11 = *(uint *)&puVar2[2].handle_queue.prev;
    if (uVar11 == 0) goto LAB_001b3156;
    uVar11 = uVar11 | *(uint *)((long)&puVar2[2].handle_queue.next + 4);
    *(uint *)((long)&puVar2[2].handle_queue.next + 4) = uVar11;
    *(undefined4 *)&puVar2[2].handle_queue.prev = 0;
    auStack_98._0_8_ = (void *)0x1b3129;
    iVar4 = uv_poll_start(puVar2,uVar11,connection_poll_cb);
    pcStack_88 = (connection_context_t *)(long)iVar4;
    auStack_98._8_8_ = (uv_loop_t *)0x0;
    if (pcStack_88 == (connection_context_t *)0x0) {
      return pcStack_88;
    }
  }
  else {
    auStack_98._0_8_ = (void *)0x1b3156;
    delay_timer_cb_cold_1();
LAB_001b3156:
    auStack_98._0_8_ = (void *)0x1b315b;
    delay_timer_cb_cold_3();
  }
  ppcVar12 = &pcStack_88;
  auStack_98._0_8_ = connection_close_cb;
  delay_timer_cb_cold_2();
  pcVar14 = *ppcVar12;
  piVar10 = &pcVar14->open_handles;
  *piVar10 = *piVar10 + -1;
  if (*piVar10 != 0) {
    return extraout_RAX_00;
  }
  if (test_mode == '\x01') {
    if (pcVar14->is_server_connection != 0) {
      auStack_98._0_8_ = pcVar14->read;
      if ((void *)auStack_98._0_8_ == (void *)0x10000) {
        auStack_98._0_8_ = pcVar14->sent;
        if ((void *)auStack_98._0_8_ == (void *)0x0) goto LAB_001b3259;
        pcVar14 = (connection_context_t *)auStack_98;
        connection_close_cb_cold_2();
        goto LAB_001b31e7;
      }
      goto LAB_001b3208;
    }
LAB_001b3217:
    auStack_98._0_8_ = pcVar14->read;
    if ((void *)auStack_98._0_8_ != (void *)0x0) goto LAB_001b3277;
  }
  else {
LAB_001b31e7:
    auStack_98._0_8_ = pcVar14->read;
    if ((void *)auStack_98._0_8_ != (void *)0x10000) {
LAB_001b3208:
      pcVar14 = (connection_context_t *)auStack_98;
      connection_close_cb_cold_1();
      goto LAB_001b3217;
    }
  }
  auStack_98._0_8_ = pcVar14->sent;
  if ((void *)auStack_98._0_8_ == (void *)0x10000) {
LAB_001b3259:
    closed_connections = closed_connections + 1;
    free(pcVar14);
    return extraout_RAX_01;
  }
  connection_close_cb_cold_4();
LAB_001b3277:
  puVar13 = (undefined8 *)auStack_98;
  connection_close_cb_cold_3();
  free((void *)*puVar13);
  return extraout_RAX_02;
joined_r0x001b2e9b:
  if ((uv_loop_t *)0xffff < puVar7) goto switchD_001b2c49_caseD_4;
  pcVar14 = (connection_context_t *)(0x10000 - (long)puVar7);
  if (puVar7 < (uv_loop_t *)0xfb2f) {
    pcVar14 = (connection_context_t *)0x4d2;
  }
  pcStack_68 = (connection_context_t *)0x0;
  pcStack_60 = pcVar14;
  if ((long)pcVar14 < 1) goto LAB_001b30a9;
  while( true ) {
    pcStack_78 = (connection_context_t *)0x1b2ef2;
    sVar9 = send(puVar2[1].io_watcher.fd,connection_poll_cb::buffer_3,(size_t)pcVar14,0);
    uVar5 = (uint)sVar9;
    if (uVar5 != 0xffffffff) break;
    pcStack_78 = (connection_context_t *)0x1b2efc;
    piVar10 = __errno_location();
    iVar4 = *piVar10;
    if (iVar4 != 4) goto LAB_001b2ffc;
  }
  if (uVar5 == 0) goto LAB_001b304a;
  if ((int)uVar5 < 0) {
    pcStack_78 = (connection_context_t *)0x1b2ffa;
    piVar10 = __errno_location();
    iVar4 = *piVar10;
LAB_001b2ffc:
    if ((iVar4 != 0xb) && (iVar4 != 0x73)) {
      pcStack_78 = (connection_context_t *)0x1b3013;
      connection_poll_cb_cold_11();
      unaff_RBX = puVar6;
      goto LAB_001b3013;
    }
    goto switchD_001b2c49_caseD_4;
  }
  puVar7 = (uv_loop_t *)((long)(puVar2[2].loop)->reserved + ((ulong)(uVar5 & 0x7fffffff) - 0x38));
  puVar2[2].loop = puVar7;
  goto joined_r0x001b2e9b;
}

Assistant:

static connection_context_t* create_connection_context(
    uv_os_sock_t sock, int is_server_connection) {
  int r;
  connection_context_t* context;

  context = (connection_context_t*) malloc(sizeof *context);
  ASSERT_NOT_NULL(context);

  context->sock = sock;
  context->is_server_connection = is_server_connection;
  context->read = 0;
  context->sent = 0;
  context->open_handles = 0;
  context->events = 0;
  context->delayed_events = 0;
  context->got_fin = 0;
  context->sent_fin = 0;
  context->got_disconnect = 0;

  r = uv_poll_init(uv_default_loop(), &context->poll_handle, sock);
  context->open_handles++;
  context->poll_handle.data = context;
  ASSERT_OK(r);

  r = uv_timer_init(uv_default_loop(), &context->timer_handle);
  context->open_handles++;
  context->timer_handle.data = context;
  ASSERT_OK(r);

  return context;
}